

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall
QPDF::validateStreamLineEnd(QPDF *this,QPDFObjectHandle *object,QPDFObjGen og,qpdf_offset_t offset)

{
  long *plVar1;
  long lVar2;
  qpdf_offset_t qVar3;
  char ch;
  allocator<char> local_d1;
  string local_d0;
  QPDFExc local_b0;
  
  while (plVar1 = *(long **)&(((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
        lVar2 = (**(code **)(*plVar1 + 0x38))(plVar1,&ch,1), lVar2 != 0) {
    switch(ch) {
    case '\n':
      goto switchD_001e502e_caseD_a;
    case '\r':
      plVar1 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      lVar2 = (**(code **)(*plVar1 + 0x38))(plVar1,&ch,1);
      if (lVar2 == 0) {
        return;
      }
      if (ch == '\n') {
        return;
      }
      plVar1 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar1 + 0x40))(plVar1,(int)ch);
      qVar3 = (**(code **)(**(long **)&(((this->m)._M_t.
                                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                        )->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x20))();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"stream keyword followed by carriage return only",&local_d1);
      damagedPDF(&local_b0,this,qVar3,&local_d0);
      warn(this,&local_b0);
LAB_001e517c:
      QPDFExc::~QPDFExc(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      return;
    default:
      if (ch != ' ') {
        plVar1 = *(long **)&(((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar1 + 0x40))(plVar1,(int)ch);
        qVar3 = (**(code **)(**(long **)&(((this->m)._M_t.
                                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl)->file).
                                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                            + 0x20))();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"stream keyword not followed by proper line terminator",
                   &local_d1);
        damagedPDF(&local_b0,this,qVar3,&local_d0);
        warn(this,&local_b0);
        goto LAB_001e517c;
      }
    case '\t':
    case '\v':
    case '\f':
      qVar3 = (**(code **)(**(long **)&(((this->m)._M_t.
                                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                        )->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x20))();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"stream keyword followed by extraneous whitespace",&local_d1);
      damagedPDF(&local_b0,this,qVar3,&local_d0);
      warn(this,&local_b0);
      QPDFExc::~QPDFExc(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
switchD_001e502e_caseD_a:
  return;
}

Assistant:

void
QPDF::validateStreamLineEnd(QPDFObjectHandle& object, QPDFObjGen og, qpdf_offset_t offset)
{
    // The PDF specification states that the word "stream" should be followed by either a carriage
    // return and a newline or by a newline alone.  It specifically disallowed following it by a
    // carriage return alone since, in that case, there would be no way to tell whether the NL in a
    // CR NL sequence was part of the stream data.  However, some readers, including Adobe reader,
    // accept a carriage return by itself when followed by a non-newline character, so that's what
    // we do here. We have also seen files that have extraneous whitespace between the stream
    // keyword and the newline.
    while (true) {
        char ch;
        if (m->file->read(&ch, 1) == 0) {
            // A premature EOF here will result in some other problem that will get reported at
            // another time.
            return;
        }
        if (ch == '\n') {
            // ready to read stream data
            QTC::TC("qpdf", "QPDF stream with NL only");
            return;
        }
        if (ch == '\r') {
            // Read another character
            if (m->file->read(&ch, 1) != 0) {
                if (ch == '\n') {
                    // Ready to read stream data
                    QTC::TC("qpdf", "QPDF stream with CRNL");
                } else {
                    // Treat the \r by itself as the whitespace after endstream and start reading
                    // stream data in spite of not having seen a newline.
                    QTC::TC("qpdf", "QPDF stream with CR only");
                    m->file->unreadCh(ch);
                    warn(damagedPDF(
                        m->file->tell(), "stream keyword followed by carriage return only"));
                }
            }
            return;
        }
        if (!util::is_space(ch)) {
            QTC::TC("qpdf", "QPDF stream without newline");
            m->file->unreadCh(ch);
            warn(damagedPDF(
                m->file->tell(), "stream keyword not followed by proper line terminator"));
            return;
        }
        warn(damagedPDF(m->file->tell(), "stream keyword followed by extraneous whitespace"));
    }
}